

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLChar.cpp
# Opt level: O1

bool xercesc_4_0::XMLChar1_1::isValidNCName(XMLCh *toCheck,XMLSize_t count)

{
  XMLCh *pXVar1;
  XMLCh XVar2;
  bool bVar3;
  bool bVar4;
  XMLCh *pXVar5;
  
  if (count != 0) {
    XVar2 = *toCheck;
    if ((ushort)(XVar2 + L'⠀') < 0x380) {
      if (0xfbff < (ushort)(toCheck[1] + L'\x2000')) {
        pXVar5 = toCheck + 2;
LAB_0025244f:
        pXVar1 = toCheck + count;
        if (pXVar1 <= pXVar5) {
          return pXVar1 <= pXVar5;
        }
        bVar3 = false;
        do {
          XVar2 = *pXVar5;
          if ((XVar2 & 0xfc00U) == 0xdc00) {
            bVar4 = false;
            if (!bVar3) {
              return false;
            }
          }
          else if ((XVar2 & 0xfc00U) == 0xd800) {
            if (0xdb7f < (ushort)XVar2) {
              return false;
            }
            bVar4 = true;
            if (bVar3) {
              return false;
            }
          }
          else {
            if (bVar3) {
              return false;
            }
            bVar4 = false;
            if (((&fgCharCharsTable1_1)[(ushort)XVar2] & 1) == 0) {
              return false;
            }
          }
          bVar3 = bVar4;
          pXVar5 = pXVar5 + 1;
          if (pXVar1 <= pXVar5) {
            return pXVar1 <= pXVar5;
          }
        } while( true );
      }
    }
    else if ((XVar2 != L':') && (((&fgCharCharsTable1_1)[(ushort)XVar2] & 2) != 0)) {
      pXVar5 = toCheck + 1;
      goto LAB_0025244f;
    }
  }
  return false;
}

Assistant:

bool XMLChar1_1::isValidNCName(const   XMLCh* const    toCheck
                               , const XMLSize_t       count)
{
    if (count == 0)
        return false;

    const XMLCh* curCh = toCheck;
    const XMLCh* endPtr = toCheck + count;

    XMLCh nextCh = *curCh++;
    if ((nextCh >= 0xD800) && (nextCh <= 0xDB7F)) {
        nextCh = *curCh++;
        if ((nextCh < 0xDC00) || (nextCh > 0xDFFF))
            return false;
    }
    else if (nextCh== chColon || !(fgCharCharsTable1_1[nextCh] & gFirstNameCharMask))
            return false;

    bool    gotLeadingSurrogate = false;
    while (curCh < endPtr)
    {
        nextCh = *curCh++;

        // Deal with surrogate pairs
        if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
        {
            //  It's a leading surrogate. If we already got one, then
            //  issue an error, else set leading flag to make sure that
            //  we look for a trailing next time.
            if (nextCh > 0xDB7F || gotLeadingSurrogate)
            {
                return false;
            }
            else
                gotLeadingSurrogate = true;
        }
        else
        {
            //  If it's a trailing surrogate, make sure that we are
            //  prepared for that. Else, it's just a regular char so make
            //  sure that we were not expected a trailing surrogate.
            if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
            {
                // It's trailing, so make sure we were expecting it
                if (!gotLeadingSurrogate)
                    return false;
            }
            else
            {
                //  It's just a char, so make sure we were not expecting a
                //  trailing surrogate.
                if (gotLeadingSurrogate) {
                    return false;
                }
                // It's got to at least be a valid XML character
                else if (!(fgCharCharsTable1_1[nextCh] & gNCNameCharMask))
                {
                    return false;
                }
            }
            gotLeadingSurrogate = false;
        }
    }
    return true;
}